

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2dcf93::FunctionEncoding::printRight(FunctionEncoding *this,OutputStream *S)

{
  Node *pNVar1;
  Qualifiers QVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = '(';
  S->CurrentPosition = S->CurrentPosition + 1;
  NodeArray::printWithComma(&this->Params,S);
  OutputStream::grow(S,1);
  S->Buffer[S->CurrentPosition] = ')';
  S->CurrentPosition = S->CurrentPosition + 1;
  pNVar1 = this->Ret;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  QVar2 = this->CVQuals;
  if ((QVar2 & QualConst) != QualNone) {
    OutputStream::grow(S,6);
    builtin_strncpy(S->Buffer + S->CurrentPosition," const",6);
    S->CurrentPosition = S->CurrentPosition + 6;
    QVar2 = this->CVQuals;
  }
  if ((QVar2 & QualVolatile) != QualNone) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," volatile",9);
    S->CurrentPosition = S->CurrentPosition + 9;
    QVar2 = this->CVQuals;
  }
  if ((QVar2 & QualRestrict) != QualNone) {
    OutputStream::grow(S,9);
    builtin_strncpy(S->Buffer + S->CurrentPosition," restrict",9);
    S->CurrentPosition = S->CurrentPosition + 9;
  }
  if (this->RefQual == FrefQualRValue) {
    lVar5 = 3;
    OutputStream::grow(S,3);
    pcVar3 = S->Buffer;
    sVar4 = S->CurrentPosition;
    pcVar3[sVar4 + 2] = '&';
  }
  else {
    if (this->RefQual != FrefQualLValue) goto LAB_00191f56;
    lVar5 = 2;
    OutputStream::grow(S,2);
    pcVar3 = S->Buffer;
    sVar4 = S->CurrentPosition;
  }
  (pcVar3 + sVar4)[0] = ' ';
  (pcVar3 + sVar4)[1] = '&';
  S->CurrentPosition = S->CurrentPosition + lVar5;
LAB_00191f56:
  pNVar1 = this->Attrs;
  if (pNVar1 != (Node *)0x0) {
    (*pNVar1->_vptr_Node[4])(pNVar1,S);
    if (pNVar1->RHSComponentCache != No) {
      (*pNVar1->_vptr_Node[5])(pNVar1,S);
      return;
    }
  }
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    S += "(";
    Params.printWithComma(S);
    S += ")";
    if (Ret)
      Ret->printRight(S);

    if (CVQuals & QualConst)
      S += " const";
    if (CVQuals & QualVolatile)
      S += " volatile";
    if (CVQuals & QualRestrict)
      S += " restrict";

    if (RefQual == FrefQualLValue)
      S += " &";
    else if (RefQual == FrefQualRValue)
      S += " &&";

    if (Attrs != nullptr)
      Attrs->print(S);
  }